

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parsing.h
# Opt level: O1

int __thiscall Parsing::getSymbol(Parsing *this)

{
  char *pcVar1;
  byte *pbVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  ostream *this_00;
  long *plVar6;
  ulong uVar7;
  size_type sVar8;
  long lVar9;
  const_iterator __end1;
  byte *pbVar10;
  int iVar11;
  byte *pbVar12;
  int iVar13;
  bool bVar14;
  int symbol;
  int number;
  string target;
  int local_88;
  int local_84;
  string local_80;
  int local_5c;
  vector<Word,std::allocator<Word>> *local_58;
  byte *local_50;
  long local_48;
  long local_40 [2];
  
  filter(this);
  pbVar12 = (byte *)(this->content)._M_dataplus._M_p;
  local_58 = (vector<Word,std::allocator<Word>> *)&this->words;
  do {
    pbVar10 = (byte *)((this->content)._M_dataplus._M_p + (this->content)._M_string_length);
    if (pbVar12 == pbVar10) {
      return 0;
    }
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    local_80._M_string_length = 0;
    local_80.field_2._M_local_buf[0] = '\0';
    do {
      if ((*pbVar12 != 0x20) && (*pbVar12 != 9)) break;
      pbVar12 = pbVar12 + 1;
    } while (pbVar12 != pbVar10);
    if (pbVar12 == pbVar10) {
      iVar13 = 3;
    }
    else {
      bVar3 = *pbVar12;
      pbVar10 = pbVar12;
      if (pbVar12 != (byte *)((this->content)._M_dataplus._M_p + (this->content)._M_string_length))
      {
        local_5c = bVar3 - 0x30;
        while ((bVar4 = *pbVar10, bVar4 != 9 && (bVar4 != 0x20))) {
          uVar5 = (uint)bVar4;
          uVar7 = (ulong)uVar5;
          if ((((((byte)((bVar3 & 0xdf) + 0xbf) < 0x1a) &&
                ((uVar5 < 0x3f && ((0x7c00ff0800000000U >> (uVar7 & 0x3f) & 1) != 0)))) ||
               (((bVar3 < 0x3f & (byte)(0x7c00ff0800000000 >> (bVar3 & 0x3f))) != 0 &&
                (((byte)(bVar4 - 0x30) < 10 || ((byte)((bVar4 & 0xdf) + 0xbf) < 0x1a)))))) ||
              (((byte)local_5c < 10 &&
               ((bVar4 < 0x3f && ((0x7c00ff0800000000U >> (uVar7 & 0x3f) & 1) != 0)))))) ||
             ((uVar5 < 0x3f &&
              ((((0x7c00ff0800000000U >> (uVar7 & 0x3f) & 1) != 0 &&
                (local_80._M_string_length != 0)) &&
               ((local_80._M_string_length != 1 ||
                (((uVar5 != 0x3d || (0x3e < bVar3)) ||
                 ((0x5400000000000000U >> ((ulong)(uint)bVar3 & 0x3f) & 1) == 0)))))))))) break;
          std::__cxx11::string::push_back((char)&local_80);
          pbVar10 = pbVar10 + 1;
          if (pbVar10 ==
              (byte *)((this->content)._M_dataplus._M_p + (this->content)._M_string_length)) break;
        }
      }
      local_88 = getReservation(this,&local_80);
      local_84 = 0;
      if (local_88 == -1) {
        bVar14 = local_80._M_string_length == 0;
        if ((!bVar14) && ((byte)(*local_80._M_dataplus._M_p - 0x30U) < 10)) {
          sVar8 = 1;
          do {
            bVar14 = local_80._M_string_length == sVar8;
            if (bVar14) break;
            pcVar1 = local_80._M_dataplus._M_p + sVar8;
            sVar8 = sVar8 + 1;
          } while ((byte)(*pcVar1 - 0x30U) < 10);
        }
        if (bVar14) {
          local_88 = this->constBase;
          if (local_80._M_string_length == 0) {
            local_84 = 0;
          }
          else {
            sVar8 = 0;
            local_84 = 0;
            do {
              local_84 = (int)local_80._M_dataplus._M_p[sVar8] + local_84 * 10 + -0x30;
              sVar8 = sVar8 + 1;
            } while (local_80._M_string_length != sVar8);
          }
        }
        local_50 = (byte *)local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,local_80._M_dataplus._M_p,
                   local_80._M_dataplus._M_p + local_80._M_string_length);
        if ((byte)((*local_50 & 0xdf) + 0xa5) < 0xe6) {
          bVar14 = false;
        }
        else {
          bVar14 = local_48 == 0;
          if ((!bVar14) &&
             (((byte)(*local_50 - 0x30) < 10 || ((byte)((*local_50 & 0xdf) + 0xbf) < 0x1a)))) {
            lVar9 = 1;
            do {
              bVar14 = local_48 == lVar9;
              if (bVar14) break;
              pbVar2 = local_50 + lVar9;
              lVar9 = lVar9 + 1;
            } while (((byte)(*pbVar2 - 0x30) < 10) || ((byte)((*pbVar2 & 0xdf) + 0xbf) < 0x1a));
          }
        }
        if (local_50 != (byte *)local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
        if (bVar14) {
          local_88 = this->identifierBase;
        }
      }
      iVar11 = (int)pbVar12 - *(int *)&(this->content)._M_dataplus._M_p;
      std::vector<Word,std::allocator<Word>>::
      emplace_back<std::__cxx11::string&,int&,int&,int&,int&>
                (local_58,&local_80,&local_88,&local_84,
                 (this->contentLine).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + iVar11,
                 (this->contentRow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + iVar11);
      iVar13 = 0;
      pbVar12 = pbVar10;
      if (local_88 == -1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"parsing error in ",0x11);
        this_00 = (ostream *)
                  std::ostream::operator<<
                            ((ostream *)&std::cout,
                             (this->contentLine).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start[iVar11]);
        std::__ostream_insert<char,std::char_traits<char>>(this_00,":",1);
        plVar6 = (long *)std::ostream::operator<<
                                   (this_00,(this->contentRow).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start[iVar11]);
        std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
        std::ostream::put((char)plVar6);
        iVar13 = 1;
        std::ostream::flush();
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,
                      CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                               local_80.field_2._M_local_buf[0]) + 1);
    }
    if (iVar13 != 0) {
      iVar11 = 0;
      if (iVar13 != 3) {
        iVar11 = -1;
      }
      return iVar11;
    }
  } while( true );
}

Assistant:

int getSymbol() {
		filter();
		auto now = content.begin();
		while (now != content.end()) {
			std::string target;

			while (now != content.end() && ISSPC(*now)) now++;
			auto nowPosition = now;
			if (now == content.end()) break;

			bool isDiv = ISDIV(*now);
			bool isLet = ISLET(*now);
			bool isNum = ISNUM(*now);
			char doubleDiv = *now;
			while (now != content.end() && ! ISSPC(*now)) {
				if (isLet && ISDIV(*now)) break;
				if (isDiv && (ISLET(*now) || ISNUM(*now))) break;
				if (isNum && ISDIV(*now)) break;
				if (ISDIV(*now)) {
					if (target.length() == 1) {
						if (*now == '='){
							if (doubleDiv != '<' && doubleDiv != '>' && doubleDiv != ':') break;
						} else break;
					} else if (target.length() >= 2) break;
				}
				target += *now;
				now++;
			}

			int symbol = getReservation(target);
			int number = 0;
			if (symbol == -1) {
				if (isNumber(target)) {
					symbol = constBase;
					number = getNumber(target);
				}
				if (isIdentifier(target)) symbol = identifierBase;
			}

			int targetPosition = nowPosition - content.begin();
			words.emplace_back(target, symbol, number, contentLine[targetPosition], contentRow[targetPosition]);

			if (symbol == -1) {
				std::cout << "parsing error in " << contentLine[targetPosition] <<
											 ":" << contentRow[targetPosition] << std::endl;
				return -1;
			}
		}
		return 0;
	}